

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vstat.cc
# Opt level: O2

bool anon_unknown.dwarf_3816::OutputStatistics
               (StatisticsAccumulation *accumulation,Buffer *buffer,int vector_length,
               OutputFormats output_format,double confidence_level,
               bool outputs_only_diagonal_elements)

{
  bool bVar1;
  _Vector_base<double,_std::allocator<double>_> *this;
  size_type __n;
  allocator_type local_f1;
  vector<double,_std::allocator<double>_> mean;
  int num_data_1;
  vector<double,_std::allocator<double>_> tmp;
  int num_data;
  vector<double,_std::allocator<double>_> first;
  
  __n = (size_type)vector_length;
  if ((output_format < kSufficientStatistics) && ((0x43U >> (output_format & 0x1f) & 1) != 0)) {
    std::vector<double,_std::allocator<double>_>::vector(&mean,__n,(allocator_type *)&first);
    bVar1 = sptk::StatisticsAccumulation::GetMean(accumulation,buffer,&mean);
    if (bVar1) {
      bVar1 = sptk::WriteStream<double>(0,vector_length,&mean,(ostream *)&std::cout,(int *)0x0);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&mean.super__Vector_base<double,_std::allocator<double>_>);
      if (!bVar1) {
        return false;
      }
      goto LAB_00104d3c;
    }
LAB_00105189:
    this = &mean.super__Vector_base<double,_std::allocator<double>_>;
LAB_0010518e:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(this);
    return false;
  }
LAB_00104d3c:
  if ((output_format & ~kCovariance) == kMeanAndCovariance) {
    if (outputs_only_diagonal_elements) {
      std::vector<double,_std::allocator<double>_>::vector(&mean,__n,(allocator_type *)&first);
      bVar1 = sptk::StatisticsAccumulation::GetDiagonalCovariance(accumulation,buffer,&mean);
      if (!bVar1) goto LAB_00105189;
      bVar1 = sptk::WriteStream<double>(0,vector_length,&mean,(ostream *)&std::cout,(int *)0x0);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&mean.super__Vector_base<double,_std::allocator<double>_>);
    }
    else {
      sptk::SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)&mean,vector_length);
      bVar1 = sptk::StatisticsAccumulation::GetFullCovariance
                        (accumulation,buffer,(SymmetricMatrix *)&mean);
      if (!bVar1) goto LAB_0010515c;
      bVar1 = sptk::WriteStream((SymmetricMatrix *)&mean,(ostream *)&std::cout);
      sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)&mean);
    }
    if (bVar1 == false) {
      return false;
    }
  }
  switch(output_format) {
  case kStandardDeviation:
    std::vector<double,_std::allocator<double>_>::vector(&mean,__n,(allocator_type *)&first);
    bVar1 = sptk::StatisticsAccumulation::GetStandardDeviation(accumulation,buffer,&mean);
    if (!bVar1) goto LAB_00105189;
    bVar1 = sptk::WriteStream<double>(0,vector_length,&mean,(ostream *)&std::cout,(int *)0x0);
LAB_00104daa:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&mean.super__Vector_base<double,_std::allocator<double>_>);
    goto LAB_00105147;
  case kCorrelation:
    sptk::SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)&mean,vector_length);
    bVar1 = sptk::StatisticsAccumulation::GetCorrelation
                      (accumulation,buffer,(SymmetricMatrix *)&mean);
    if (!bVar1) goto LAB_0010515c;
    bVar1 = sptk::WriteStream((SymmetricMatrix *)&mean,(ostream *)&std::cout);
    break;
  case kPrecision:
    sptk::SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)&mean,vector_length);
    bVar1 = sptk::StatisticsAccumulation::GetFullCovariance
                      (accumulation,buffer,(SymmetricMatrix *)&mean);
    if (!bVar1) {
LAB_0010515c:
      sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)&mean);
      return false;
    }
    sptk::SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)&first,vector_length);
    bVar1 = sptk::SymmetricMatrix::Invert((SymmetricMatrix *)&mean,(SymmetricMatrix *)&first);
    if (!bVar1) {
      sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)&first);
      goto LAB_0010515c;
    }
    bVar1 = sptk::WriteStream((SymmetricMatrix *)&first,(ostream *)&std::cout);
    sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)&first);
    break;
  case kMeanAndLowerAndUpperBounds:
    bVar1 = sptk::StatisticsAccumulation::GetNumData(accumulation,buffer,&num_data_1);
    if (!bVar1) {
      return false;
    }
    std::vector<double,_std::allocator<double>_>::vector(&mean,__n,(allocator_type *)&first);
    bVar1 = sptk::StatisticsAccumulation::GetMean(accumulation,buffer,&mean);
    if (bVar1) {
      std::vector<double,_std::allocator<double>_>::vector(&first,__n,(allocator_type *)&tmp);
      bVar1 = sptk::StatisticsAccumulation::GetDiagonalCovariance(accumulation,buffer,&first);
      if (bVar1) {
        std::vector<double,_std::allocator<double>_>::vector(&tmp,__n,(allocator_type *)&num_data);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&num_data,__n,&local_f1);
        bVar1 = sptk::ComputeLowerAndUpperBounds
                          (confidence_level,num_data_1,&mean,&first,&tmp,
                           (vector<double,_std::allocator<double>_> *)&num_data);
        if ((bVar1) &&
           (bVar1 = sptk::WriteStream<double>(0,vector_length,&tmp,(ostream *)&std::cout,(int *)0x0)
           , bVar1)) {
          bVar1 = sptk::WriteStream<double>
                            (0,vector_length,(vector<double,_std::allocator<double>_> *)&num_data,
                             (ostream *)&std::cout,(int *)0x0);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&num_data);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&tmp.super__Vector_base<double,_std::allocator<double>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&first.super__Vector_base<double,_std::allocator<double>_>);
          goto LAB_00104daa;
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&num_data);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&tmp.super__Vector_base<double,_std::allocator<double>_>);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&first.super__Vector_base<double,_std::allocator<double>_>);
    }
    goto LAB_00105189;
  case kSufficientStatistics:
    bVar1 = sptk::StatisticsAccumulation::GetNumData(accumulation,buffer,&num_data);
    if (!bVar1) {
      return false;
    }
    bVar1 = sptk::WriteStream<double>((double)num_data,(ostream *)&std::cout);
    if (!bVar1) {
      return false;
    }
    first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = sptk::StatisticsAccumulation::GetFirst(accumulation,buffer,&first);
    if ((bVar1) &&
       (bVar1 = sptk::WriteStream<double>(0,vector_length,&first,(ostream *)&std::cout,(int *)0x0),
       bVar1)) {
      sptk::SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)&mean,0);
      bVar1 = sptk::StatisticsAccumulation::GetSecond(accumulation,buffer,(SymmetricMatrix *)&mean);
      if (bVar1) {
        if (outputs_only_diagonal_elements) {
          std::vector<double,_std::allocator<double>_>::vector
                    (&tmp,__n,(allocator_type *)&num_data_1);
          bVar1 = sptk::SymmetricMatrix::GetDiagonal((SymmetricMatrix *)&mean,&tmp);
          if (bVar1) {
            bVar1 = sptk::WriteStream<double>(0,vector_length,&tmp,(ostream *)&std::cout,(int *)0x0)
            ;
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      (&tmp.super__Vector_base<double,_std::allocator<double>_>);
            if (bVar1) goto LAB_001051bc;
          }
          else {
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      (&tmp.super__Vector_base<double,_std::allocator<double>_>);
          }
        }
        else {
          bVar1 = sptk::WriteStream((SymmetricMatrix *)&mean,(ostream *)&std::cout);
          if (bVar1) {
LAB_001051bc:
            sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)&mean);
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      (&first.super__Vector_base<double,_std::allocator<double>_>);
            return true;
          }
        }
      }
      sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)&mean);
    }
    this = &first.super__Vector_base<double,_std::allocator<double>_>;
    goto LAB_0010518e;
  default:
    goto LAB_00105195;
  }
  sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)&mean);
LAB_00105147:
  if (bVar1 == false) {
    return false;
  }
LAB_00105195:
  return true;
}

Assistant:

bool OutputStatistics(const sptk::StatisticsAccumulation& accumulation,
                      const sptk::StatisticsAccumulation::Buffer& buffer,
                      int vector_length, OutputFormats output_format,
                      double confidence_level,
                      bool outputs_only_diagonal_elements) {
  if (kMeanAndCovariance == output_format || kMean == output_format ||
      kMeanAndLowerAndUpperBounds == output_format) {
    std::vector<double> mean(vector_length);
    if (!accumulation.GetMean(buffer, &mean)) {
      return false;
    }
    if (!sptk::WriteStream(0, vector_length, mean, &std::cout, NULL)) {
      return false;
    }
  }

  if (kMeanAndCovariance == output_format || kCovariance == output_format) {
    if (outputs_only_diagonal_elements) {
      std::vector<double> variance(vector_length);
      if (!accumulation.GetDiagonalCovariance(buffer, &variance)) {
        return false;
      }
      if (!sptk::WriteStream(0, vector_length, variance, &std::cout, NULL)) {
        return false;
      }
    } else {
      sptk::SymmetricMatrix variance(vector_length);
      if (!accumulation.GetFullCovariance(buffer, &variance)) {
        return false;
      }
      if (!sptk::WriteStream(variance, &std::cout)) {
        return false;
      }
    }
  }

  if (kStandardDeviation == output_format) {
    std::vector<double> standard_deviation(vector_length);
    if (!accumulation.GetStandardDeviation(buffer, &standard_deviation)) {
      return false;
    }
    if (!sptk::WriteStream(0, vector_length, standard_deviation, &std::cout,
                           NULL)) {
      return false;
    }
  }

  if (kCorrelation == output_format) {
    sptk::SymmetricMatrix correlation(vector_length);
    if (!accumulation.GetCorrelation(buffer, &correlation)) {
      return false;
    }
    if (!sptk::WriteStream(correlation, &std::cout)) {
      return false;
    }
  }

  if (kPrecision == output_format) {
    sptk::SymmetricMatrix variance(vector_length);
    if (!accumulation.GetFullCovariance(buffer, &variance)) {
      return false;
    }

    sptk::SymmetricMatrix precision_matrix(vector_length);
    if (!variance.Invert(&precision_matrix)) {
      return false;
    }

    if (!sptk::WriteStream(precision_matrix, &std::cout)) {
      return false;
    }
  }

  if (kMeanAndLowerAndUpperBounds == output_format) {
    int num_data;
    if (!accumulation.GetNumData(buffer, &num_data)) {
      return false;
    }
    std::vector<double> mean(vector_length);
    if (!accumulation.GetMean(buffer, &mean)) {
      return false;
    }
    std::vector<double> variance(vector_length);
    if (!accumulation.GetDiagonalCovariance(buffer, &variance)) {
      return false;
    }

    std::vector<double> lower_bound(vector_length);
    std::vector<double> upper_bound(vector_length);
    if (!sptk::ComputeLowerAndUpperBounds(confidence_level, num_data, mean,
                                          variance, &lower_bound,
                                          &upper_bound)) {
      return false;
    }

    if (!sptk::WriteStream(0, vector_length, lower_bound, &std::cout, NULL)) {
      return false;
    }
    if (!sptk::WriteStream(0, vector_length, upper_bound, &std::cout, NULL)) {
      return false;
    }
  }

  if (kSufficientStatistics == output_format) {
    int num_data;
    if (!accumulation.GetNumData(buffer, &num_data)) {
      return false;
    }
    if (!sptk::WriteStream(static_cast<double>(num_data), &std::cout)) {
      return false;
    }

    std::vector<double> first;
    if (!accumulation.GetFirst(buffer, &first)) {
      return false;
    }
    if (!sptk::WriteStream(0, vector_length, first, &std::cout, NULL)) {
      return false;
    }

    sptk::SymmetricMatrix second;
    if (!accumulation.GetSecond(buffer, &second)) {
      return false;
    }
    if (outputs_only_diagonal_elements) {
      std::vector<double> tmp(vector_length);
      if (!second.GetDiagonal(&tmp)) {
        return false;
      }
      if (!sptk::WriteStream(0, vector_length, tmp, &std::cout, NULL)) {
        return false;
      }
    } else {
      if (!sptk::WriteStream(second, &std::cout)) {
        return false;
      }
    }
  }

  return true;
}